

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fastprojectile.cpp
# Opt level: O1

void __thiscall AFastProjectile::Tick(AFastProjectile *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  sector_t *psVar5;
  bool bVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  AActor *target;
  bool bVar11;
  line_t *plVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  FCheckPosition tm;
  DVector3 local_100;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  FCheckPosition local_c8;
  
  dVar2 = (this->super_AActor).__Pos.X;
  dVar15 = (this->super_AActor).__Pos.Y;
  (this->super_AActor).Prev.Z = (this->super_AActor).__Pos.Z;
  (this->super_AActor).Prev.X = dVar2;
  (this->super_AActor).Prev.Y = dVar15;
  (this->super_AActor).PrevAngles.Roll.Degrees = (this->super_AActor).Angles.Roll.Degrees;
  dVar2 = (this->super_AActor).Angles.Yaw.Degrees;
  (this->super_AActor).PrevAngles.Pitch.Degrees = (this->super_AActor).Angles.Pitch.Degrees;
  (this->super_AActor).PrevAngles.Yaw.Degrees = dVar2;
  psVar5 = (this->super_AActor).Sector;
  if (psVar5 == (sector_t *)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = psVar5->PortalGroup;
  }
  (this->super_AActor).PrevPortalGroup = iVar9;
  if (((this->super_AActor).flags5.Value & 0x400000) == 0) {
    if ((bglobal._16_1_ & 1) != 0) {
      return;
    }
    if (((byte)level.flags2 & 0x20) != 0) {
      return;
    }
  }
  bVar11 = (bool)(*(byte *)((long)&(this->super_AActor).flags2.Value + 1) & 1);
  local_c8.LastRipped.NumUsed = 0;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
            (&local_c8.LastRipped,1);
  local_c8.PushTime = 0;
  local_c8.FromPMove = false;
  dVar2 = (this->super_AActor).radius;
  uVar13 = 8;
  if (0.0 < dVar2) {
    uVar10 = 8;
    do {
      do {
        uVar13 = (ulong)uVar10;
        dVar15 = (double)(int)uVar10 * dVar2;
        uVar10 = uVar10 * 2;
      } while (dVar15 < ABS((this->super_AActor).Vel.X));
    } while (dVar15 < ABS((this->super_AActor).Vel.Y));
  }
  dVar2 = (this->super_AActor).Vel.X;
  dVar15 = (this->super_AActor).Vel.Y;
  local_c8.DoRipping = bVar11;
  if (((((dVar2 == 0.0) && (!NAN(dVar2))) && (dVar15 == 0.0)) &&
      ((!NAN(dVar15) && (dVar16 = (this->super_AActor).Vel.Z, dVar16 == 0.0)))) && (!NAN(dVar16))) {
    dVar16 = (this->super_AActor).__Pos.Z;
    pdVar1 = &(this->super_AActor).floorz;
    if ((dVar16 == *pdVar1) && (!NAN(dVar16) && !NAN(*pdVar1))) goto LAB_005e3b5a;
  }
  if (0 < (int)uVar13) {
    dVar16 = 1.0 / (double)(int)uVar13;
    local_d8 = dVar2 * dVar16;
    local_e8 = dVar15 * dVar16;
    dVar2 = (this->super_AActor).Vel.Z;
    uStack_d0 = 0;
    bVar11 = local_d8 != 0.0;
    uStack_e0 = 0;
    bVar6 = local_e8 != 0.0;
    uVar7 = uVar13 >> 3;
    uVar14 = uVar7;
    do {
      if (bVar6 || bVar11) {
        if ((int)uVar14 < 2) {
          M_Free(local_c8.LastRipped.Nodes);
          local_c8.LastRipped.Nodes = (Node *)0x0;
          local_c8.LastRipped.LastFree = (Node *)0x0;
          local_c8.LastRipped.Size = 0;
          local_c8.LastRipped.NumUsed = 0;
          TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
                    (&local_c8.LastRipped,1);
        }
        local_100.X = (this->super_AActor).__Pos.X + local_d8;
        local_100.Y = (this->super_AActor).__Pos.Y + local_e8;
        bVar8 = P_TryMove(&this->super_AActor,(DVector2 *)&local_100,1,(secplane_t *)0x0,&local_c8,
                          false);
        if (bVar8) {
          uVar14 = (ulong)((int)uVar14 - 1);
          goto LAB_005e3ada;
        }
        if ((((this->super_AActor).flags3.Value & 0x4000) == 0) &&
           (((((local_c8.ceilingline != (line_t *)0x0 &&
               (psVar5 = (local_c8.ceilingline)->backsector, psVar5 != (sector_t *)0x0)) &&
              (psVar5->planes[1].Texture.texnum == skyflatnum.texnum)) &&
             (dVar2 = (this->super_AActor).__Pos.Z,
             AActor::PosRelative(&local_100,&this->super_AActor,local_c8.ceilingline),
             (local_100.Y * (psVar5->ceilingplane).normal.Y +
             local_100.X * (psVar5->ceilingplane).normal.X + (psVar5->ceilingplane).D) *
             (psVar5->ceilingplane).negiC <= dVar2)) ||
            ((plVar12 = (this->super_AActor).BlockingLine, plVar12 != (line_t *)0x0 &&
             (plVar12->special == 9)))))) goto LAB_005e3cc2;
        target = (this->super_AActor).BlockingMobj;
        plVar12 = (this->super_AActor).BlockingLine;
LAB_005e3cdb:
        P_ExplodeMissile(&this->super_AActor,plVar12,target);
        goto LAB_005e3ce3;
      }
LAB_005e3ada:
      (this->super_AActor).__Pos.Z = (this->super_AActor).__Pos.Z + dVar16 * dVar2;
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x24])(this);
      dVar15 = (this->super_AActor).__Pos.Z;
      dVar3 = (this->super_AActor).floorz;
      if (dVar15 <= dVar3) {
        if (((this->super_AActor).floorpic.texnum != skyflatnum.texnum) ||
           (((this->super_AActor).flags3.Value & 0x4000) != 0)) {
          (this->super_AActor).__Pos.Z = dVar3;
          P_HitFloor(&this->super_AActor);
LAB_005e3c17:
          plVar12 = (line_t *)0x0;
          target = (AActor *)0x0;
          goto LAB_005e3cdb;
        }
LAB_005e3cc2:
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
        goto LAB_005e3ce3;
      }
      dVar3 = (this->super_AActor).ceilingz;
      dVar4 = (this->super_AActor).Height;
      if (dVar3 < dVar15 + dVar4) {
        if (((this->super_AActor).ceilingpic.texnum == skyflatnum.texnum) &&
           (((this->super_AActor).flags3.Value & 0x4000) == 0)) goto LAB_005e3cc2;
        (this->super_AActor).__Pos.Z = dVar3 - dVar4;
        goto LAB_005e3c17;
      }
      if ((int)uVar14 < 1 && (bVar6 || bVar11)) {
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])(this);
        uVar14 = uVar7;
      }
      uVar10 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar10;
    } while (uVar10 != 0);
  }
LAB_005e3b5a:
  bVar11 = AActor::CheckNoDelay(&this->super_AActor);
  if ((bVar11) && (iVar9 = (this->super_AActor).tics, iVar9 != -1)) {
    if (0 < iVar9) {
      (this->super_AActor).tics = iVar9 + -1;
    }
    if ((this->super_AActor).tics == 0) {
      do {
        bVar11 = AActor::SetState(&this->super_AActor,((this->super_AActor).state)->NextState,false)
        ;
      } while (bVar11 && (this->super_AActor).tics == 0);
    }
  }
LAB_005e3ce3:
  M_Free(local_c8.LastRipped.Nodes);
  return;
}

Assistant:

void AFastProjectile::Tick ()
{
	int i;
	DVector3 frac;
	int changexy;

	ClearInterpolation();
	double oldz = Z();

	if (!(flags5 & MF5_NOTIMEFREEZE))
	{
		//Added by MC: Freeze mode.
		if (bglobal.freeze || level.flags2 & LEVEL2_FROZEN)
		{
			return;
		}
	}


	// [RH] Ripping is a little different than it was in Hexen
	FCheckPosition tm(!!(flags2 & MF2_RIP));

	int count = 8;
	if (radius > 0)
	{
		while ( fabs(Vel.X) > radius * count || fabs(Vel.Y) > radius * count)
		{
			// we need to take smaller steps.
			count += count;
		}
	}

	// Handle movement
	if (!Vel.isZero() || (Z() != floorz))
	{
		frac = Vel / count;
		changexy = frac.X != 0 || frac.Y != 0;
		int ripcount = count / 8;
		for (i = 0; i < count; i++)
		{
			if (changexy)
			{
				if (--ripcount <= 0)
				{
					tm.LastRipped.Clear();	// [RH] Do rip damage each step, like Hexen
				}
				
				if (!P_TryMove (this, Pos() + frac, true, NULL, tm))
				{ // Blocked move
					if (!(flags3 & MF3_SKYEXPLODE))
					{
						if (tm.ceilingline &&
							tm.ceilingline->backsector &&
							tm.ceilingline->backsector->GetTexture(sector_t::ceiling) == skyflatnum &&
							Z() >= tm.ceilingline->backsector->ceilingplane.ZatPoint(PosRelative(tm.ceilingline)))
						{
							// Hack to prevent missiles exploding against the sky.
							// Does not handle sky floors.
							Destroy ();
							return;
						}
						// [RH] Don't explode on horizon lines.
						if (BlockingLine != NULL && BlockingLine->special == Line_Horizon)
						{
							Destroy ();
							return;
						}
					}

					P_ExplodeMissile (this, BlockingLine, BlockingMobj);
					return;
				}
			}
			AddZ(frac.Z);
			UpdateWaterLevel ();
			oldz = Z();
			if (oldz <= floorz)
			{ // Hit the floor

				if (floorpic == skyflatnum && !(flags3 & MF3_SKYEXPLODE))
				{
					// [RH] Just remove the missile without exploding it
					//		if this is a sky floor.
					Destroy ();
					return;
				}

				SetZ(floorz);
				P_HitFloor (this);
				P_ExplodeMissile (this, NULL, NULL);
				return;
			}
			if (Top() > ceilingz)
			{ // Hit the ceiling

				if (ceilingpic == skyflatnum &&  !(flags3 & MF3_SKYEXPLODE))
				{
					Destroy ();
					return;
				}

				SetZ(ceilingz - Height);
				P_ExplodeMissile (this, NULL, NULL);
				return;
			}
			if (changexy && ripcount <= 0) 
			{
				ripcount = count >> 3;
				Effect();
			}
		}
	}
	if (!CheckNoDelay())
		return;		// freed itself
	// Advance the state
	if (tics != -1)
	{
		if (tics > 0) tics--;
		while (!tics)
		{
			if (!SetState (state->GetNextState ()))
			{ // mobj was removed
				return;
			}
		}
	}
}